

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_0UL>::get
          (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_0UL> *this,
          ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
              ((NullableValue<kj::Promise<void>> *)(output + 1),
               (Promise<void> *)&other[1].field_1.value);
  }
  else {
    NullableValue<kj::Promise<void>_>::operator=
              ((NullableValue<kj::Promise<void>_> *)(output + 1),(void *)0x0);
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }